

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLPrinter::PushText(XMLPrinter *this,char *text,bool cdata)

{
  bool cdata_local;
  char *text_local;
  XMLPrinter *this_local;
  
  this->_textDepth = this->_depth + -1;
  SealElementIfJustOpened(this);
  if (cdata) {
    Write(this,"<![CDATA[");
    Write(this,text);
    Write(this,"]]>");
  }
  else {
    PrintString(this,text,true);
  }
  return;
}

Assistant:

void XMLPrinter::PushText(const char* text, bool cdata)
{
    _textDepth = _depth - 1;

    SealElementIfJustOpened();
    if (cdata) {
        Write("<![CDATA[");
        Write(text);
        Write("]]>");
    } else {
        PrintString(text, true);
    }
}